

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFxu.c
# Opt level: O3

int Abc_NtkFastExtract(Abc_Ntk_t *pNtk,Fxu_Data_t *p)

{
  long *plVar1;
  long lVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Ptr_t *pVVar8;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  Abc_Obj_t *pAVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  char *__s;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFxu.c"
                  ,0x55,"int Abc_NtkFastExtract(Abc_Ntk_t *, Fxu_Data_t *)");
  }
  iVar4 = Abc_NtkToSop(pNtk,-1,1000000000);
  if (iVar4 == 0) {
    iVar4 = 0;
    __s = "Abc_NtkFastExtract(): Converting to SOPs has failed.";
  }
  else {
    lVar6 = (long)pNtk->vObjs->nSize;
    if (0 < lVar6) {
      lVar13 = 0;
      __s = 
      "Abc_NtkFastExtract: Nodes have duplicated or complemented fanins. FXU is not performed.";
      do {
        plVar1 = (long *)pNtk->vObjs->pArray[lVar13];
        if (((plVar1 != (long *)0x0) && ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 7)) &&
           (uVar15 = (ulong)*(int *)((long)plVar1 + 0x1c), 0 < (long)uVar15)) {
          lVar2 = *(long *)(*(long *)(*plVar1 + 0x20) + 8);
          uVar16 = 0;
          do {
            if ((uVar16 < 2) &&
               (((uint)(uVar16 != 0) * 0x400 + 0x400 & *(uint *)((long)plVar1 + 0x14)) != 0)) {
LAB_0026ab75:
              iVar4 = 0;
              goto LAB_0026aec3;
            }
            uVar17 = 0;
            do {
              if ((uVar16 != uVar17) &&
                 (*(long *)(lVar2 + (long)*(int *)(plVar1[4] + uVar16 * 4) * 8) ==
                  *(long *)(lVar2 + (long)*(int *)(plVar1[4] + uVar17 * 4) * 8))) goto LAB_0026ab75;
              uVar17 = uVar17 + 1;
            } while (uVar15 != uVar17);
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar15);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar6);
    }
    iVar5 = 0;
    Abc_NtkCleanup(pNtk,0);
    p->pManSop = (Mem_Flex_t *)pNtk->pManFunc;
    pVVar7 = (Vec_Ptr_t *)calloc(1,0x10);
    p->vSops = pVVar7;
    pVVar8 = (Vec_Ptr_t *)calloc(1,0x10);
    p->vFanins = pVVar8;
    pVVar9 = (Vec_Ptr_t *)calloc(1,0x10);
    p->vSopsNew = pVVar9;
    pVVar9 = (Vec_Ptr_t *)calloc(1,0x10);
    p->vFaninsNew = pVVar9;
    pVVar9 = pNtk->vObjs;
    iVar4 = pVVar9->nSize;
    lVar6 = (long)iVar4;
    if (0 < lVar6) {
      ppvVar10 = (void **)malloc(lVar6 * 8);
      pVVar7->pArray = ppvVar10;
      pVVar7->nCap = iVar4;
      lVar13 = 0;
      do {
        pVVar7->pArray[lVar13] = (void *)0x0;
        lVar13 = lVar13 + 1;
      } while (lVar6 != lVar13);
      pVVar8 = p->vFanins;
      pVVar9 = pNtk->vObjs;
      iVar5 = pVVar8->nCap;
    }
    pVVar7->nSize = iVar4;
    uVar12 = pVVar9->nSize;
    if (iVar5 < (int)uVar12) {
      if (pVVar8->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc((long)(int)uVar12 << 3);
      }
      else {
        ppvVar10 = (void **)realloc(pVVar8->pArray,(long)(int)uVar12 << 3);
      }
      pVVar8->pArray = ppvVar10;
      pVVar8->nCap = uVar12;
    }
    if (0 < (int)uVar12) {
      uVar15 = 0;
      do {
        pVVar8->pArray[uVar15] = (void *)0x0;
        uVar15 = uVar15 + 1;
      } while (uVar12 != uVar15);
    }
    pVVar8->nSize = uVar12;
    pVVar9 = p->vSopsNew;
    uVar15 = (long)p->nNodesExt + (long)pNtk->vObjs->nSize;
    iVar4 = (int)uVar15;
    if (pVVar9->nCap < iVar4) {
      if (pVVar9->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc(uVar15 * 8);
      }
      else {
        ppvVar10 = (void **)realloc(pVVar9->pArray,uVar15 * 8);
      }
      pVVar9->pArray = ppvVar10;
      pVVar9->nCap = iVar4;
    }
    if (0 < iVar4) {
      uVar16 = 0;
      do {
        pVVar9->pArray[uVar16] = (void *)0x0;
        uVar16 = uVar16 + 1;
      } while ((uVar15 & 0xffffffff) != uVar16);
    }
    pVVar9->nSize = iVar4;
    pVVar9 = p->vFaninsNew;
    uVar15 = (long)p->nNodesExt + (long)pNtk->vObjs->nSize;
    iVar4 = (int)uVar15;
    if (pVVar9->nCap < iVar4) {
      if (pVVar9->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc(uVar15 * 8);
      }
      else {
        ppvVar10 = (void **)realloc(pVVar9->pArray,uVar15 * 8);
      }
      pVVar9->pArray = ppvVar10;
      pVVar9->nCap = iVar4;
    }
    if (0 < iVar4) {
      uVar16 = 0;
      do {
        pVVar9->pArray[uVar16] = (void *)0x0;
        uVar16 = uVar16 + 1;
      } while ((uVar15 & 0xffffffff) != uVar16);
    }
    pVVar9->nSize = iVar4;
    pVVar9 = pNtk->vObjs;
    iVar4 = pVVar9->nSize;
    if (0 < iVar4) {
      lVar6 = 0;
      do {
        pvVar3 = pVVar9->pArray[lVar6];
        if ((((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x14) & 0xf) == 7)) &&
            (iVar4 = Abc_SopGetVarNum(*(char **)((long)pvVar3 + 0x38)), 1 < iVar4)) &&
           (iVar4 = Abc_SopGetCubeNum(*(char **)((long)pvVar3 + 0x38)), 0 < iVar4)) {
          p->vSops->pArray[lVar6] = *(void **)((long)pvVar3 + 0x38);
          p->vFanins->pArray[lVar6] = (void *)((long)pvVar3 + 0x18);
        }
        lVar6 = lVar6 + 1;
        pVVar9 = pNtk->vObjs;
        iVar4 = pVVar9->nSize;
      } while (lVar6 < iVar4);
    }
    p->nNodesOld = iVar4;
    iVar4 = Fxu_FastExtract(p);
    if (iVar4 < 1) {
      iVar4 = 0;
      __s = "Warning: The network has not been changed by \"fx\".";
    }
    else {
      pVVar9 = p->vFanins;
      uVar12 = pVVar9->nSize;
      if (p->vFaninsNew->nSize <= (int)uVar12) {
        __assert_fail("p->vFanins->nSize < p->vFaninsNew->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFxu.c"
                      ,0xf0,"void Abc_NtkFxuReconstruct(Abc_Ntk_t *, Fxu_Data_t *)");
      }
      iVar4 = p->nNodesNew;
      uVar14 = uVar12;
      if (0 < iVar4) {
        do {
          pAVar11 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
          if (uVar14 != pAVar11->Id) {
            __assert_fail("i == (int)pNode->Id",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFxu.c"
                          ,0xf6,"void Abc_NtkFxuReconstruct(Abc_Ntk_t *, Fxu_Data_t *)");
          }
          uVar14 = uVar14 + 1;
          pVVar9 = p->vFanins;
          uVar12 = pVVar9->nSize;
          iVar4 = p->nNodesNew;
        } while ((int)uVar14 < (int)(iVar4 + uVar12));
      }
      if (0 < (int)uVar12) {
        lVar6 = 0;
        do {
          if (p->vFaninsNew->pArray[lVar6] != (void *)0x0) {
            if (pNtk->vObjs->nSize <= lVar6) goto LAB_0026aed9;
            pAVar11 = (Abc_Obj_t *)pNtk->vObjs->pArray[lVar6];
            Abc_ObjRemoveFanins(pAVar11);
            pvVar3 = p->vFaninsNew->pArray[lVar6];
            if (0 < *(int *)((long)pvVar3 + 4)) {
              lVar13 = 0;
              do {
                iVar4 = *(int *)(*(long *)((long)pvVar3 + 8) + lVar13 * 4);
                if (((long)iVar4 < 0) || (pNtk->vObjs->nSize <= iVar4)) goto LAB_0026aed9;
                Abc_ObjAddFanin(pAVar11,(Abc_Obj_t *)pNtk->vObjs->pArray[iVar4]);
                lVar13 = lVar13 + 1;
              } while (lVar13 < *(int *)((long)pvVar3 + 4));
            }
            pvVar3 = p->vSopsNew->pArray[lVar6];
            (pAVar11->field_5).pData = pvVar3;
            if (pvVar3 == (void *)0x0) {
              __assert_fail("pNode->pData != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFxu.c"
                            ,0x10a,"void Abc_NtkFxuReconstruct(Abc_Ntk_t *, Fxu_Data_t *)");
            }
            pVVar9 = p->vFanins;
          }
          lVar6 = lVar6 + 1;
          uVar12 = pVVar9->nSize;
        } while (lVar6 < (int)uVar12);
        iVar4 = p->nNodesNew;
      }
      if (0 < iVar4) {
        if ((int)uVar12 < 0) {
LAB_0026aed9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar15 = (ulong)uVar12;
        do {
          if (pNtk->vObjs->nSize <= (int)uVar15) goto LAB_0026aed9;
          pAVar11 = (Abc_Obj_t *)pNtk->vObjs->pArray[uVar15];
          pvVar3 = p->vFaninsNew->pArray[uVar15];
          if (0 < *(int *)((long)pvVar3 + 4)) {
            lVar6 = 0;
            do {
              iVar4 = *(int *)(*(long *)((long)pvVar3 + 8) + lVar6 * 4);
              if (((long)iVar4 < 0) || (pNtk->vObjs->nSize <= iVar4)) goto LAB_0026aed9;
              Abc_ObjAddFanin(pAVar11,(Abc_Obj_t *)pNtk->vObjs->pArray[iVar4]);
              lVar6 = lVar6 + 1;
            } while (lVar6 < *(int *)((long)pvVar3 + 4));
          }
          pvVar3 = p->vSopsNew->pArray[uVar15];
          (pAVar11->field_5).pData = pvVar3;
          if (pvVar3 == (void *)0x0) {
            __assert_fail("pNode->pData != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFxu.c"
                          ,0x119,"void Abc_NtkFxuReconstruct(Abc_Ntk_t *, Fxu_Data_t *)");
          }
          uVar15 = uVar15 + 1;
        } while ((int)uVar15 < p->nNodesNew + p->vFanins->nSize);
      }
      iVar5 = Abc_NtkCheck(pNtk);
      iVar4 = 1;
      if (iVar5 != 0) {
        return 1;
      }
      __s = "Abc_NtkFastExtract: The network check has failed.";
    }
  }
LAB_0026aec3:
  puts(__s);
  return iVar4;
}

Assistant:

int Abc_NtkFastExtract( Abc_Ntk_t * pNtk, Fxu_Data_t * p )
{
    assert( Abc_NtkIsLogic(pNtk) );
    // if the network is already in the SOP form, it may come from BLIF file
    // and it may not be SCC-free, in which case FXU will not work correctly
    if ( Abc_NtkIsSopLogic(pNtk) )
    { // to make sure the SOPs are SCC-free
//        Abc_NtkSopToBdd(pNtk);
//        Abc_NtkBddToSop(pNtk);
    }
    // get the network in the SOP form
    if ( !Abc_NtkToSop(pNtk, -1, ABC_INFINITY) )
    {
        printf( "Abc_NtkFastExtract(): Converting to SOPs has failed.\n" );
        return 0;
    }
    // check if the network meets the requirements
    if ( !Abc_NtkFxuCheck(pNtk) )
    {
        printf( "Abc_NtkFastExtract: Nodes have duplicated or complemented fanins. FXU is not performed.\n" );
        return 0;
    }
    // sweep removes useless nodes
    Abc_NtkCleanup( pNtk, 0 );
    // collect information about the covers
    Abc_NtkFxuCollectInfo( pNtk, p );
    // call the fast extract procedure
    if ( Fxu_FastExtract(p) > 0 )
    {
        // update the network
        Abc_NtkFxuReconstruct( pNtk, p );
        // make sure everything is okay
        if ( !Abc_NtkCheck( pNtk ) )
            printf( "Abc_NtkFastExtract: The network check has failed.\n" );
        return 1;
    }
    else
        printf( "Warning: The network has not been changed by \"fx\".\n" );
    return 0;
}